

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlnNtk.c
# Opt level: O3

void Wln_NtkTransferNames(Wln_Ntk_t *pNew,Wln_Ntk_t *p)

{
  uint uVar1;
  int iVar2;
  int *piVar3;
  long lVar4;
  int iVar5;
  
  if ((pNew->pManName != (Abc_Nam_t *)0x0) || (p->pManName == (Abc_Nam_t *)0x0)) {
    __assert_fail("pNew->pManName == NULL && p->pManName != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wln/wlnNtk.c"
                  ,0x113,"void Wln_NtkTransferNames(Wln_Ntk_t *, Wln_Ntk_t *)");
  }
  pNew->pManName = p->pManName;
  p->pManName = (Abc_Nam_t *)0x0;
  if ((0 < (pNew->vCopies).nSize) || ((p->vCopies).nSize < 1)) {
    __assert_fail("!Wln_NtkHasCopy(pNew) && Wln_NtkHasCopy(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wln/wlnNtk.c"
                  ,0x116,"void Wln_NtkTransferNames(Wln_Ntk_t *, Wln_Ntk_t *)");
  }
  if (0 < (p->vNameIds).nSize) {
    if (0 < (pNew->vNameIds).nSize) {
      __assert_fail("!Wln_NtkHasNameId(pNew) && Wln_NtkHasNameId(p)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wln/wlnNtk.c"
                    ,0x11a,"void Wln_NtkTransferNames(Wln_Ntk_t *, Wln_Ntk_t *)");
    }
    uVar1 = (pNew->vTypes).nCap;
    if ((pNew->vNameIds).nCap < (int)uVar1) {
      piVar3 = (pNew->vNameIds).pArray;
      if (piVar3 == (int *)0x0) {
        piVar3 = (int *)malloc((long)(int)uVar1 << 2);
      }
      else {
        piVar3 = (int *)realloc(piVar3,(long)(int)uVar1 << 2);
      }
      (pNew->vNameIds).pArray = piVar3;
      if (piVar3 == (int *)0x0) goto LAB_003861bc;
      (pNew->vNameIds).nCap = uVar1;
    }
    if (0 < (int)uVar1) {
      memset((pNew->vNameIds).pArray,0,(ulong)uVar1 * 4);
    }
    (pNew->vNameIds).nSize = uVar1;
    iVar5 = (p->vTypes).nSize;
    if (1 < iVar5) {
      lVar4 = 1;
      do {
        if ((p->vCopies).nSize <= lVar4) goto LAB_00386121;
        uVar1 = (p->vCopies).pArray[lVar4];
        if (((ulong)uVar1 != 0) && (lVar4 < (p->vNameIds).nSize)) {
          iVar2 = (p->vNameIds).pArray[lVar4];
          if (iVar2 != 0) {
            if (((int)uVar1 < 0) || ((pNew->vNameIds).nSize <= (int)uVar1)) goto LAB_00386140;
            (pNew->vNameIds).pArray[uVar1] = iVar2;
            iVar5 = (p->vTypes).nSize;
          }
        }
        lVar4 = lVar4 + 1;
      } while (lVar4 < iVar5);
    }
    piVar3 = (p->vNameIds).pArray;
    if (piVar3 != (int *)0x0) {
      free(piVar3);
      (p->vNameIds).pArray = (int *)0x0;
    }
    (p->vNameIds).nCap = 0;
    (p->vNameIds).nSize = 0;
  }
  if (0 < (p->vInstIds).nSize) {
    if (0 < (pNew->vInstIds).nSize) {
      __assert_fail("!Wln_NtkHasInstId(pNew) && Wln_NtkHasInstId(p)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wln/wlnNtk.c"
                    ,0x124,"void Wln_NtkTransferNames(Wln_Ntk_t *, Wln_Ntk_t *)");
    }
    uVar1 = (pNew->vTypes).nCap;
    if ((pNew->vInstIds).nCap < (int)uVar1) {
      piVar3 = (pNew->vInstIds).pArray;
      if (piVar3 == (int *)0x0) {
        piVar3 = (int *)malloc((long)(int)uVar1 << 2);
      }
      else {
        piVar3 = (int *)realloc(piVar3,(long)(int)uVar1 << 2);
      }
      (pNew->vInstIds).pArray = piVar3;
      if (piVar3 == (int *)0x0) {
LAB_003861bc:
        __assert_fail("p->pArray",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
      }
      (pNew->vInstIds).nCap = uVar1;
    }
    if (0 < (int)uVar1) {
      memset((pNew->vInstIds).pArray,0,(ulong)uVar1 * 4);
    }
    (pNew->vInstIds).nSize = uVar1;
    iVar5 = (p->vTypes).nSize;
    if (1 < iVar5) {
      lVar4 = 1;
      do {
        if ((p->vCopies).nSize <= lVar4) {
LAB_00386121:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        uVar1 = (p->vCopies).pArray[lVar4];
        if ((((ulong)uVar1 != 0) && (lVar4 < (p->vInstIds).nSize)) &&
           (iVar2 = (p->vInstIds).pArray[lVar4], iVar2 != 0)) {
          if (((int)uVar1 < 0) || ((pNew->vInstIds).nSize <= (int)uVar1)) {
LAB_00386140:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                          ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
          }
          (pNew->vInstIds).pArray[uVar1] = iVar2;
          iVar5 = (p->vTypes).nSize;
        }
        lVar4 = lVar4 + 1;
      } while (lVar4 < iVar5);
    }
    piVar3 = (p->vInstIds).pArray;
    if (piVar3 != (int *)0x0) {
      free(piVar3);
      (p->vInstIds).pArray = (int *)0x0;
    }
    (p->vInstIds).nCap = 0;
    (p->vInstIds).nSize = 0;
  }
  return;
}

Assistant:

void Wln_NtkTransferNames( Wln_Ntk_t * pNew, Wln_Ntk_t * p )
{
    assert( pNew->pManName  == NULL && p->pManName != NULL );
    pNew->pManName = p->pManName; 
    p->pManName = NULL;
    assert( !Wln_NtkHasCopy(pNew)   && Wln_NtkHasCopy(p)   );
    if ( Wln_NtkHasNameId(p) )
    {
        int i;
        assert( !Wln_NtkHasNameId(pNew) && Wln_NtkHasNameId(p) );
        Wln_NtkCleanNameId( pNew );
        Wln_NtkForEachObj( p, i ) 
            if ( Wln_ObjCopy(p, i) && i < Vec_IntSize(&p->vNameIds) && Wln_ObjNameId(p, i) )
                Wln_ObjSetNameId( pNew, Wln_ObjCopy(p, i), Wln_ObjNameId(p, i) );
        Vec_IntErase( &p->vNameIds );
    }
    if ( Wln_NtkHasInstId(p) )
    {
        int i;
        assert( !Wln_NtkHasInstId(pNew) && Wln_NtkHasInstId(p) );
        Wln_NtkCleanInstId( pNew );
        Wln_NtkForEachObj( p, i ) 
            if ( Wln_ObjCopy(p, i) && i < Vec_IntSize(&p->vInstIds) && Wln_ObjInstId(p, i) )
                Wln_ObjSetInstId( pNew, Wln_ObjCopy(p, i), Wln_ObjInstId(p, i) );
        Vec_IntErase( &p->vInstIds );
    }
}